

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program.c
# Opt level: O3

Translation_Data *
get_translation_data(Map *types,Linkage *internal_linkage,Linkage *external_linkage)

{
  Translation_Data *pTVar1;
  Queue *q;
  Queue *q_00;
  Queue *q_01;
  Map *tree;
  
  pTVar1 = (Translation_Data *)malloc(0x40);
  q = (Queue *)malloc(0x18);
  pTVar1->tokens = q;
  q_00 = (Queue *)malloc(0x18);
  pTVar1->errors = q_00;
  q_01 = (Queue *)malloc(0x18);
  pTVar1->source_files = q_01;
  Queue_Init(q);
  Queue_Init(q_00);
  Queue_Init(q_01);
  tree = (Map *)malloc(0x810);
  pTVar1->macros = tree;
  Map_Init(tree);
  pTVar1->types = types;
  pTVar1->number_of_errors_when_last_checked = 0;
  pTVar1->external_linkage = external_linkage;
  pTVar1->internal_linkage = internal_linkage;
  return pTVar1;
}

Assistant:

struct Translation_Data* get_translation_data(struct Map *types,struct Linkage *internal_linkage,struct Linkage *external_linkage)
{
	struct Translation_Data *ret;
	ret=malloc(sizeof(struct Translation_Data));
	ret->tokens=malloc(sizeof(struct Queue));
	ret->errors=malloc(sizeof(struct Queue));
	ret->source_files=malloc(sizeof(struct Queue));
	Queue_Init(ret->tokens);
	Queue_Init(ret->errors);
	Queue_Init(ret->source_files);

	ret->macros=malloc(sizeof(struct Map));
	Map_Init(ret->macros);

	ret->types=types;

	ret->number_of_errors_when_last_checked=0;

	ret->external_linkage=external_linkage;
	ret->internal_linkage=internal_linkage;

	return ret;
}